

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O2

SoapySDRArgInfo *
SoapySDRDevice_getSettingInfoWithKey
          (SoapySDRArgInfo *__return_storage_ptr__,SoapySDRDevice *device,char *key)

{
  undefined1 *puVar1;
  allocator local_129;
  string local_128 [32];
  ArgInfo local_108;
  
  puVar1 = (undefined1 *)__tls_get_addr(&PTR_0014be88);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 0x400) = 0;
  std::__cxx11::string::string(local_128,key,&local_129);
  (**(code **)(*(long *)device + 0x328))(&local_108,device,local_128);
  toArgInfo(__return_storage_ptr__,&local_108);
  SoapySDR::ArgInfo::~ArgInfo(&local_108);
  std::__cxx11::string::~string(local_128);
  return __return_storage_ptr__;
}

Assistant:

SoapySDRArgInfo SoapySDRDevice_getSettingInfoWithKey(const SoapySDRDevice *device, const char *key)
{
    __SOAPY_SDR_C_TRY
    return toArgInfo(device->getSettingInfo(key));
    __SOAPY_SDR_C_CATCH_RET(SoapySDRArgInfo())
}